

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_command_queue
clCreateCommandQueueWithPropertiesKHR
          (cl_context context,cl_device_id device,cl_queue_properties_khr *properties,
          cl_int *errcode_ret)

{
  _Rb_tree_header *p_Var1;
  CTracker *pCVar2;
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar3;
  mapped_type *pmVar4;
  cl_command_queue queue;
  time_point end;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  cl_queue_properties *newProperties;
  cl_int localErrorCode;
  cl_platform_id platform;
  string propsStr;
  cl_device_id local_b8;
  cl_context local_b0;
  cl_queue_properties *local_a8;
  time_point local_a0;
  cl_int local_94;
  string local_90;
  string local_70;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) goto LAB_001305d3;
  local_70._M_dataplus._M_p = (pointer)0x0;
  local_b8 = device;
  (*(g_pIntercept->m_Dispatch).clGetDeviceInfo)(device,0x1031,8,&local_70,(size_t *)0x0);
  p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_00130443:
    local_70._M_dataplus._M_p = (pointer)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)&local_70);
  }
  else {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(pointer *)(p_Var5 + 1) >= local_70._M_dataplus._M_p) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(pointer *)(p_Var5 + 1) < local_70._M_dataplus._M_p];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) ||
       (local_70._M_dataplus._M_p < *(pointer *)(p_Var6 + 1))) goto LAB_00130443;
    pmVar4 = (mapped_type *)&p_Var6[1]._M_parent;
  }
  if (pmVar4->clCreateCommandQueueWithPropertiesKHR ==
      (_func_cl_command_queue_cl_context_cl_device_id_cl_queue_properties_khr_ptr_cl_int_ptr *)0x0)
  {
LAB_001305d3:
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_command_queue)0x0;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  local_a8 = (cl_queue_properties *)0x0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar3 = (this->m_Config).CallLogging;
  if ((bool)bVar3 == true) {
    CLIntercept::getDeviceInfoString(this,1,&local_b8,&local_70);
    CLIntercept::getCommandQueuePropertiesString(this,properties,&local_50);
    bVar3 = (this->m_Config).CallLogging;
  }
  if ((bVar3 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clCreateCommandQueueWithPropertiesKHR",enqueueCounter,(cl_kernel)0x0,
               "context = %p, device = %s, properties = [ %s ]",context,local_70._M_dataplus._M_p,
               local_50._M_dataplus._M_p);
  }
  if ((this->m_Config).DummyOutOfOrderQueue == true) {
    CLIntercept::dummyCommandQueue(this,context,local_b8);
  }
  if (((((((this->m_Config).DevicePerformanceTiming != false) ||
         ((this->m_Config).ITTPerformanceTiming != false)) ||
        ((this->m_Config).ChromePerformanceTiming != false)) ||
       (((this->m_Config).DevicePerfCounterEventBasedSampling != false ||
        ((this->m_Config).InOrderQueue != false)))) || ((this->m_Config).NoProfilingQueue != false))
     || (((this->m_Config).DefaultQueuePriorityHint != 0 ||
         ((this->m_Config).DefaultQueueThrottleHint != 0)))) {
    CLIntercept::createCommandQueuePropertiesOverride(this,local_b8,properties,&local_a8);
  }
  local_94 = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_001305ab:
      errcode_ret = &local_94;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_001305ab;
  local_b0 = context;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_a0.__d.__r = (duration)0;
  }
  else {
    local_a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  if ((this->m_Config).DevicePerfCounterEventBasedSampling == true) {
    if ((local_a8 == (cl_queue_properties *)0x0) ||
       (queue = CLIntercept::createMDAPICommandQueue(this,local_b0,local_b8,local_a8,errcode_ret),
       queue == (cl_command_queue)0x0)) {
      queue = CLIntercept::createMDAPICommandQueue(this,local_b0,local_b8,properties,errcode_ret);
      goto LAB_00130651;
    }
  }
  else {
    queue = (cl_command_queue)0x0;
LAB_00130651:
    if (local_a8 != (cl_queue_properties_khr *)0x0 && queue == (cl_command_queue)0x0) {
      queue = (*pmVar4->clCreateCommandQueueWithPropertiesKHR)
                        (local_b0,local_b8,local_a8,errcode_ret);
    }
    if (queue == (cl_command_queue)0x0) {
      queue = (*pmVar4->clCreateCommandQueueWithPropertiesKHR)
                        (local_b0,local_b8,properties,errcode_ret);
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      CLIntercept::updateHostTimingStats
                (this,"clCreateCommandQueueWithPropertiesKHR",&local_90,local_a0,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
  }
  if (local_a8 != (cl_queue_properties *)0x0) {
    operator_delete__(local_a8);
  }
  local_a8 = (cl_queue_properties *)0x0;
  if ((this->m_Config).ErrorLogging == false) {
    bVar3 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar3 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_00130797;
  }
  else {
    if (*errcode_ret == 0) goto LAB_00130797;
    CLIntercept::logError(this,"clCreateCommandQueueWithPropertiesKHR",*errcode_ret);
    bVar3 = (this->m_Config).ErrorAssert;
  }
  if ((bVar3 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_00130797:
  if ((queue != (cl_command_queue)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar2 = &(this->m_ObjectTracker).m_CommandQueues;
    (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateCommandQueueWithPropertiesKHR",*errcode_ret,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0,"returned %p",queue);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clCreateCommandQueueWithPropertiesKHR",&local_90,false,0,local_a0,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if (queue != (cl_command_queue)0x0) {
    if ((((this->m_Config).ChromePerformanceTiming != false) ||
        ((this->m_Config).Emulate_cl_intel_unified_shared_memory == true)) &&
       (CLIntercept::addQueue(this,local_b0,queue), (this->m_Config).ChromePerformanceTiming == true
       )) {
      CLIntercept::chromeRegisterCommandQueue(this,queue);
    }
    if ((this->m_Config).QueueInfoLogging == true) {
      CLIntercept::logQueueInfo(this,local_b8,queue);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return queue;
  }
  operator_delete(local_70._M_dataplus._M_p);
  return queue;
}

Assistant:

CL_API_ENTRY cl_command_queue CL_API_CALL clCreateCommandQueueWithPropertiesKHR(
    cl_context context,
    cl_device_id device,
    const cl_queue_properties_khr* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(device);
        if( dispatchX.clCreateCommandQueueWithPropertiesKHR )
        {
            GET_ENQUEUE_COUNTER();

            cl_queue_properties*    newProperties = NULL;
            cl_command_queue    retVal = NULL;

            std::string deviceInfo;
            std::string propsStr;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getDeviceInfoString(
                    1,
                    &device,
                    deviceInfo );
                pIntercept->getCommandQueuePropertiesString(
                    properties,
                    propsStr );
            }
            CALL_LOGGING_ENTER( "context = %p, device = %s, properties = [ %s ]",
                context,
                deviceInfo.c_str(),
                propsStr.c_str() );
            DUMMY_COMMAND_QUEUE( context, device );
            CREATE_COMMAND_QUEUE_OVERRIDE_INIT( device, properties, newProperties );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

#if defined(USE_MDAPI)
            if( pIntercept->config().DevicePerfCounterEventBasedSampling )
            {
                if( ( retVal == NULL ) && newProperties )
                {
                    retVal = pIntercept->createMDAPICommandQueue(
                        context,
                        device,
                        newProperties,
                        errcode_ret );
                }
                if( retVal == NULL )
                {
                    retVal = pIntercept->createMDAPICommandQueue(
                        context,
                        device,
                        properties,
                        errcode_ret );
                }
            }
#endif

            if( ( retVal == NULL ) && newProperties )
            {
                retVal = dispatchX.clCreateCommandQueueWithPropertiesKHR(
                    context,
                    device,
                    newProperties,
                    errcode_ret );
            }
            if( retVal == NULL )
            {
                retVal = dispatchX.clCreateCommandQueueWithPropertiesKHR(
                    context,
                    device,
                    properties,
                    errcode_ret );
            }

            HOST_PERFORMANCE_TIMING_END();
            COMMAND_QUEUE_PROPERTIES_CLEANUP( newProperties );
            CHECK_ERROR( errcode_ret[0] );
            ADD_OBJECT_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );
            ADD_QUEUE( context, retVal );
            QUEUE_INFO_LOGGING( device, retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}